

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetExtensionIdentifierName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,FieldDescriptor *descriptor,
          bool immutable)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  GetClassName_abi_cxx11_(&local_38,this,*(Descriptor **)(descriptor + 0x58),immutable);
  std::operator+(&bStack_58,&local_38,".");
  std::operator+(__return_storage_ptr__,&bStack_58,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)descriptor);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string ClassNameResolver::GetExtensionIdentifierName(
    const FieldDescriptor* descriptor, bool immutable) {
  return GetClassName(descriptor->containing_type(), immutable) + "." +
         descriptor->name();
}